

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GetTextureData(Texture2D texture)

{
  Texture2D texture_00;
  long lVar1;
  Texture2D TVar2;
  int iVar3;
  void *pvVar4;
  Image *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  undefined4 uStack_1c;
  
  TVar2 = texture;
  iVar5 = (int)in_RDI;
  uStack_1c = (undefined4)((ulong)in_RDI >> 0x20);
  memset(in_RDI,0,0x18);
  iVar3 = texture.height;
  if (texture.height < 0xb) {
    texture_00.mipmaps = in_stack_ffffffffffffffdc;
    texture_00.id = texture.id;
    texture_00.width = texture.width;
    texture_00.height = texture.height;
    texture_00.format = iVar5;
    pvVar4 = rlReadTexturePixels(texture_00);
    *(long *)CONCAT44(uStack_1c,iVar5) = (long)pvVar4;
    if (*(long *)CONCAT44(uStack_1c,iVar5) == 0) {
      TraceLog(4,"TEXTURE: [ID %i] Failed to retrieve pixel data",(ulong)in_stack_00000008);
    }
    else {
      lVar1 = CONCAT44(uStack_1c,iVar5);
      *(undefined4 *)(lVar1 + 8) = in_stack_0000000c;
      texture.id = TVar2.id;
      *(uint *)(lVar1 + 0xc) = texture.id;
      *(int *)(lVar1 + 0x14) = iVar3;
      *(undefined4 *)(lVar1 + 0x10) = 1;
      TraceLog(3,"TEXTURE: [ID %i] Pixel data retrieved successfully",(ulong)in_stack_00000008);
    }
  }
  else {
    TraceLog(4,"TEXTURE: [ID %i] Failed to retrieve compressed pixel data",(ulong)in_stack_00000008)
    ;
  }
  return in_RDI;
}

Assistant:

Image GetTextureData(Texture2D texture)
{
    Image image = { 0 };

    if (texture.format < PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        image.data = rlReadTexturePixels(texture);

        if (image.data != NULL)
        {
            image.width = texture.width;
            image.height = texture.height;
            image.format = texture.format;
            image.mipmaps = 1;

#if defined(GRAPHICS_API_OPENGL_ES2)
            // NOTE: Data retrieved on OpenGL ES 2.0 should be RGBA,
            // coming from FBO color buffer attachment, but it seems
            // original texture format is retrieved on RPI...
            image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
#endif
            TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Pixel data retrieved successfully", texture.id);
        }
        else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve pixel data", texture.id);
    }
    else TRACELOG(LOG_WARNING, "TEXTURE: [ID %i] Failed to retrieve compressed pixel data", texture.id);

    return image;
}